

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfOutputWritePixels(ImfOutputFile *out,int numScanLines)

{
  Imf_3_4::RgbaOutputFile::writePixels((RgbaOutputFile *)out,numScanLines);
  return 1;
}

Assistant:

int
ImfOutputWritePixels (ImfOutputFile* out, int numScanLines)
{
    try
    {
        outfile (out)->writePixels (numScanLines);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}